

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void jacobi_ss_recur(double *p2,double *dp2,double *p1,double x,int order,double alpha,double beta,
                    double *b,double *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double dVar5;
  
  *p1 = 1.0;
  *p2 = (alpha - beta) / (alpha + beta + 2.0) + x;
  *dp2 = 1.0;
  if (1 < order) {
    lVar4 = 0;
    dVar5 = 0.0;
    do {
      dVar1 = *p1;
      dVar2 = *p2;
      *p1 = dVar2;
      dVar3 = *dp2;
      *p2 = (x - b[lVar4 + 1]) * dVar2 - dVar1 * c[lVar4 + 1];
      *dp2 = ((x - b[lVar4 + 1]) * dVar3 + *p1) - dVar5 * c[lVar4 + 1];
      lVar4 = lVar4 + 1;
      dVar5 = dVar3;
    } while ((ulong)(uint)order - 1 != lVar4);
  }
  return;
}

Assistant:

void jacobi_ss_recur ( double *p2, double *dp2, double *p1, double x, int order, 
  double alpha, double beta, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SS_RECUR finds the value and derivative of a Jacobi polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 May 2006
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Output, double *P2, the value of J(ORDER)(X).
//
//    Output, double *DP2, the value of J'(ORDER)(X).
//
//    Output, double *P1, the value of J(ORDER-1)(X).
//
//    Input, double X, the point at which polynomials are evaluated.
//
//    Input, int ORDER, the order of the polynomial.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.
//
//    Input, double B[ORDER], C[ORDER], the recursion coefficients.
//
{
  double dp0;
  double dp1;
  int i;
  double p0;

  *p1 = 1.0;
  dp1 = 0.0;

  *p2 = x + ( alpha - beta ) / ( alpha + beta + 2.0 );
  *dp2 = 1.0;

  for ( i = 2; i <= order; i++ )
  {
    p0 = *p1;
    dp0 = dp1;

    *p1 = *p2;
    dp1 = *dp2;

    *p2 = ( x - b[i-1] ) *  ( *p1 ) - c[i-1] * p0;
    *dp2 = ( x - b[i-1] ) * dp1 + ( *p1 ) - c[i-1] * dp0;
  }
  return;
}